

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_partial_sig_parse
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *sig,uchar *in32)

{
  long in_RDX;
  void *in_RSI;
  int overflow;
  secp256k1_scalar tmp;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  secp256k1_callback *in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  secp256k1_scalar *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x24);
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int *)in_stack_ffffffffffffffc0)
    ;
    if (in_stack_ffffffffffffffbc == 0) {
      secp256k1_musig_partial_sig_save
                ((secp256k1_musig_partial_sig *)in_stack_ffffffffffffffc0,
                 (secp256k1_scalar *)(ulong)in_stack_ffffffffffffffb8);
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_partial_sig_parse(const secp256k1_context* ctx, secp256k1_musig_partial_sig* sig, const unsigned char *in32) {
    secp256k1_scalar tmp;
    int overflow;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(in32 != NULL);

    /* Ensure that using the signature will fail if parsing fails (and the user
     * doesn't check the return value). */
    memset(sig, 0, sizeof(*sig));

    secp256k1_scalar_set_b32(&tmp, in32, &overflow);
    if (overflow) {
        return 0;
    }
    secp256k1_musig_partial_sig_save(sig, &tmp);
    return 1;
}